

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vision.c
# Opt level: O0

void vision_recalc(int control)

{
  byte bVar1;
  char cVar2;
  uchar uVar3;
  xchar xVar4;
  bool bVar5;
  char *pcVar6;
  boolean bVar7;
  uint local_f0;
  int local_ec;
  int local_e0;
  int local_dc;
  uint local_d8;
  char local_d4;
  char local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  char local_b0;
  char local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  char local_9c;
  char local_98;
  char local_94;
  char local_90;
  int local_8c;
  int local_88;
  char old_row_val;
  int has_night_vision;
  int oldseenv;
  uchar *sv;
  rm *flev;
  rm *loc;
  int col;
  int dy;
  int dx;
  int stop;
  int start;
  int row;
  char *ranges;
  char *next_rmax;
  char *next_rmin;
  char *old_row;
  char *next_row;
  char **next_array;
  char **temp_array;
  int control_local;
  
  vision_full_recalc = '\0';
  if (in_mklev != '\0') {
    vision_full_recalc = '\0';
    return;
  }
  if (iflags.vision_inited == '\0') {
    vision_full_recalc = '\0';
    return;
  }
  temp_array._4_4_ = control;
  get_unused_cs((char ***)&next_row,&next_rmax,&ranges);
  if (((u._1052_1_ & 1) == 0) && (temp_array._4_4_ != 2)) {
    if (((u.uprops[0x1e].intrinsic != 0) ||
        (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
         (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
       ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
      view_from((int)u.uy,(int)u.ux,(char **)next_row,next_rmax,ranges,0,
                (_func_void_int_int_void_ptr *)0x0,(void *)0x0);
      next_array = viz_array;
      viz_array = (char **)next_row;
      for (stop = 0; stop < 0x15; stop = stop + 1) {
        next_rmin = next_array[stop];
        if (viz_rmin[stop] < next_rmax[stop]) {
          cVar2 = viz_rmin[stop];
        }
        else {
          cVar2 = next_rmax[stop];
        }
        local_88 = (int)cVar2;
        if (ranges[stop] < viz_rmax[stop]) {
          cVar2 = viz_rmax[stop];
        }
        else {
          cVar2 = ranges[stop];
        }
        local_8c = (int)cVar2;
        for (loc._0_4_ = local_88; (int)loc <= local_8c; loc._0_4_ = (int)loc + 1) {
          if ((next_rmin[(int)loc] & 2U) != 0) {
            newsym((int)loc,stop);
          }
        }
      }
      goto LAB_0033244e;
    }
    bVar7 = on_level(&u.uz,&dungeon_topology.d_rogue_level);
    if (bVar7 == '\0') {
      bVar5 = true;
      if ((((byte)u._1052_1_ >> 1 & 1) == 0) ||
         (bVar7 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar7 != '\0')) {
        if ((u.utrap == 0) || (u.utraptype != 1)) {
          view_from((int)u.uy,(int)u.ux,(char **)next_row,next_rmax,ranges,0,
                    (_func_void_int_int_void_ptr *)0x0,(void *)0x0);
        }
        else {
          for (stop = u.uy + -1; stop <= u.uy + 1; stop = stop + 1) {
            if (-1 < stop) {
              if (0x14 < stop) break;
              if (u.ux + -1 < 0) {
                local_98 = '\0';
              }
              else {
                local_98 = u.ux + -1;
              }
              next_rmax[stop] = local_98;
              if (u.ux + 1 < 0x50) {
                local_9c = u.ux + '\x01';
              }
              else {
                local_9c = 'O';
              }
              ranges[stop] = local_9c;
              old_row = *(char **)(next_row + (long)stop * 8);
              for (loc._0_4_ = (int)next_rmax[stop]; (int)loc <= ranges[stop];
                  loc._0_4_ = (int)loc + 1) {
                old_row[(int)loc] = '\x03';
              }
            }
          }
        }
      }
      else {
        bVar5 = false;
        for (stop = u.uy + -1; stop <= u.uy + 1; stop = stop + 1) {
          for (loc._0_4_ = u.ux + -1; (int)loc <= u.ux + 1; loc._0_4_ = (int)loc + 1) {
            if ((((0 < (int)loc) && ((int)loc < 0x50)) && (-1 < stop)) &&
               ((stop < 0x15 && (bVar7 = is_pool(level,(int)loc,stop), bVar7 != '\0')))) {
              local_90 = (char)(int)loc;
              local_94 = local_90;
              if (next_rmax[stop] < (int)loc) {
                local_90 = next_rmax[stop];
              }
              next_rmax[stop] = local_90;
              if ((int)loc < ranges[stop]) {
                local_94 = ranges[stop];
              }
              ranges[stop] = local_94;
              *(undefined1 *)(*(long *)(next_row + (long)stop * 8) + (long)(int)loc) = 3;
            }
          }
        }
      }
      if (-1 < u.xray_range) {
        if (u.xray_range == 0) {
          *(byte *)(*(long *)(next_row + (long)u.uy * 8) + (long)u.ux) =
               *(byte *)(*(long *)(next_row + (long)u.uy * 8) + (long)u.ux) | 2;
          level->locations[u.ux][u.uy].seenv = 0xff;
          xVar4 = u.ux;
          if (next_rmax[u.uy] <= u.ux) {
            xVar4 = next_rmax[u.uy];
          }
          next_rmax[u.uy] = xVar4;
          xVar4 = u.ux;
          if (u.ux <= ranges[u.uy]) {
            xVar4 = ranges[u.uy];
          }
          ranges[u.uy] = xVar4;
        }
        else {
          cVar2 = ""[u.xray_range];
          pcVar6 = 
          "\x01\x01\x02\x02\x01\x03\x03\x02\x01\x04\x04\x04\x03\x02\x05\x05\x05\x04\x03\x02\x06\x06\x06\x05\x05\x04\x02\a\a\a\x06\x06\x05\x04\x02\b\b\b\a\a\x06\x06\x04\x02\t\t\t\t\b\b\a\x06\x05\x03\n\n\n\n\t\t\b\a\x06\x05\x03\v\v\v\v\n\n\t\t\b\a\x05\x03\f\f\f\f\v\v\n\n\t\b\a\x05\x03\r\r\r\r\f\f\f\v\n\n\t\a\x06\x03\x0e\x0e\x0e\x0e\r\r\r\f\f\v\n\t\b\x06\x03\x0f\x0f\x0f\x0f\x0e\x0e\x0e\r\r\f\v\n\t\b\x06\x03\x10"
          ;
          for (stop = u.uy - u.xray_range; stop <= u.uy + u.xray_range; stop = stop + 1) {
            if (-1 < stop) {
              if (0x14 < stop) break;
              if (u.uy - stop < 0) {
                local_a0 = -(u.uy - stop);
              }
              else {
                local_a0 = u.uy - stop;
              }
              old_row = *(char **)(next_row + (long)stop * 8);
              if ((int)u.ux - (int)pcVar6[(long)local_a0 + (long)(int)cVar2] < 0) {
                local_a4 = 0;
              }
              else {
                local_a4 = (int)u.ux - (int)pcVar6[(long)local_a0 + (long)(int)cVar2];
              }
              if ((int)u.ux + (int)pcVar6[(long)local_a0 + (long)(int)cVar2] < 0x50) {
                local_a8 = (int)u.ux + (int)pcVar6[(long)local_a0 + (long)(int)cVar2];
              }
              else {
                local_a8 = 0x4f;
              }
              for (loc._0_4_ = local_a4; (int)loc <= local_a8; loc._0_4_ = (int)loc + 1) {
                bVar1 = old_row[(int)loc];
                old_row[(int)loc] = old_row[(int)loc] | 2;
                uVar3 = level->locations[(int)loc][stop].seenv;
                level->locations[(int)loc][stop].seenv = 0xff;
                if (((bVar1 & 2) == 0) || (uVar3 != 0xff)) {
                  newsym((int)loc,stop);
                }
              }
              if (local_a4 < next_rmax[stop]) {
                local_ac = (char)local_a4;
              }
              else {
                local_ac = next_rmax[stop];
              }
              next_rmax[stop] = local_ac;
              if (ranges[stop] < local_a8) {
                local_b0 = (char)local_a8;
              }
              else {
                local_b0 = ranges[stop];
              }
              ranges[stop] = local_b0;
            }
          }
        }
      }
      if ((bVar5) && (u.xray_range < u.nv_range)) {
        if (u.nv_range == 0) {
          *(byte *)(*(long *)(next_row + (long)u.uy * 8) + (long)u.ux) =
               *(byte *)(*(long *)(next_row + (long)u.uy * 8) + (long)u.ux) | 2;
          level->locations[u.ux][u.uy].seenv = 0xff;
          xVar4 = u.ux;
          if (next_rmax[u.uy] <= u.ux) {
            xVar4 = next_rmax[u.uy];
          }
          next_rmax[u.uy] = xVar4;
          xVar4 = u.ux;
          if (u.ux <= ranges[u.uy]) {
            xVar4 = ranges[u.uy];
          }
          ranges[u.uy] = xVar4;
        }
        else if (0 < u.nv_range) {
          cVar2 = ""[u.nv_range];
          pcVar6 = 
          "\x01\x01\x02\x02\x01\x03\x03\x02\x01\x04\x04\x04\x03\x02\x05\x05\x05\x04\x03\x02\x06\x06\x06\x05\x05\x04\x02\a\a\a\x06\x06\x05\x04\x02\b\b\b\a\a\x06\x06\x04\x02\t\t\t\t\b\b\a\x06\x05\x03\n\n\n\n\t\t\b\a\x06\x05\x03\v\v\v\v\n\n\t\t\b\a\x05\x03\f\f\f\f\v\v\n\n\t\b\a\x05\x03\r\r\r\r\f\f\f\v\n\n\t\a\x06\x03\x0e\x0e\x0e\x0e\r\r\r\f\f\v\n\t\b\x06\x03\x0f\x0f\x0f\x0f\x0e\x0e\x0e\r\r\f\v\n\t\b\x06\x03\x10"
          ;
          for (stop = u.uy - u.nv_range; stop <= u.uy + u.nv_range; stop = stop + 1) {
            if (-1 < stop) {
              if (0x14 < stop) break;
              if (u.uy - stop < 0) {
                local_c4 = -(u.uy - stop);
              }
              else {
                local_c4 = u.uy - stop;
              }
              old_row = *(char **)(next_row + (long)stop * 8);
              if ((int)u.ux - (int)pcVar6[(long)local_c4 + (long)(int)cVar2] < 0) {
                local_c8 = 0;
              }
              else {
                local_c8 = (int)u.ux - (int)pcVar6[(long)local_c4 + (long)(int)cVar2];
              }
              if ((int)u.ux + (int)pcVar6[(long)local_c4 + (long)(int)cVar2] < 0x50) {
                local_cc = (int)u.ux + (int)pcVar6[(long)local_c4 + (long)(int)cVar2];
              }
              else {
                local_cc = 0x4f;
              }
              for (loc._0_4_ = local_c8; (int)loc <= local_cc; loc._0_4_ = (int)loc + 1) {
                if (old_row[(int)loc] != '\0') {
                  old_row[(int)loc] = old_row[(int)loc] | 2;
                }
              }
              if (local_c8 < next_rmax[stop]) {
                local_d0 = (char)local_c8;
              }
              else {
                local_d0 = next_rmax[stop];
              }
              next_rmax[stop] = local_d0;
              if (ranges[stop] < local_cc) {
                local_d4 = (char)local_cc;
              }
              else {
                local_d4 = ranges[stop];
              }
              ranges[stop] = local_d4;
            }
          }
        }
      }
    }
    else {
      rogue_vision((char **)next_row,next_rmax,ranges);
    }
  }
  do_light_sources((char **)next_row);
  next_array = viz_array;
  viz_array = (char **)next_row;
  vision_recalc::colbump[u.ux + 1] = '\x01';
  vision_recalc::colbump[u.ux] = '\x01';
  for (stop = 0; stop < 0x15; stop = stop + 1) {
    if (u.uy - stop < 0) {
      local_d8 = 0xffffffff;
    }
    else {
      local_d8 = (uint)(u.uy != stop);
    }
    old_row = *(char **)(next_row + (long)stop * 8);
    next_rmin = next_array[stop];
    if (viz_rmin[stop] < next_rmax[stop]) {
      cVar2 = viz_rmin[stop];
    }
    else {
      cVar2 = next_rmax[stop];
    }
    local_dc = (int)cVar2;
    if (ranges[stop] < viz_rmax[stop]) {
      cVar2 = viz_rmax[stop];
    }
    else {
      cVar2 = ranges[stop];
    }
    local_e0 = (int)cVar2;
    flev = level->locations[local_dc] + stop;
    if (local_dc < u.ux) {
      local_ec = 0;
    }
    else {
      local_ec = 1;
      if (u.ux < local_dc) {
        local_ec = 2;
      }
    }
    _has_night_vision = seenv_matrix[(int)(local_d8 + 1)] + local_ec;
    loc._0_4_ = local_dc;
    while ((int)loc <= local_e0) {
      if ((old_row[(int)loc] & 2U) == 0) {
        if (((old_row[(int)loc] & 1U) == 0) ||
           (((*(uint *)&flev->field_0x6 >> 10 & 1) == 0 && ((old_row[(int)loc] & 4U) == 0)))) {
          if (((old_row[(int)loc] & 1U) == 0) || ((*(uint *)&flev->field_0x6 >> 0xb & 1) == 0)) {
LAB_00332389:
            if (((next_rmin[(int)loc] & 2U) != 0) ||
               ((old_row[(int)loc] & 1U) != (next_rmin[(int)loc] & 1U))) {
              newsym((int)loc,stop);
            }
          }
          else {
            *(uint *)&flev->field_0x6 = *(uint *)&flev->field_0x6 & 0xfffff7ff;
            newsym((int)loc,stop);
          }
        }
        else if ((((flev->typ == '\x17') || (flev->typ == '\x0f')) ||
                 ((flev->typ != '\0' && (flev->typ < '\r')))) && (viz_clear[stop][(int)loc] == '\0')
                ) {
          if (u.ux - (int)loc < 0) {
            local_f0 = 0xffffffff;
          }
          else {
            local_f0 = (uint)(u.ux != (int)loc);
          }
          if (((*(uint *)&level->locations[(int)((int)loc + local_f0)][(int)(stop + local_d8)].
                          field_0x6 >> 10 & 1) == 0) &&
             ((*(byte *)(*(long *)(next_row + (long)(int)(stop + local_d8) * 8) +
                        (long)(int)((int)loc + local_f0)) & 4) == 0)) goto LAB_00332389;
          old_row[(int)loc] = old_row[(int)loc] | 2;
          uVar3 = flev->seenv;
          flev->seenv = flev->seenv | *_has_night_vision;
          if (((next_rmin[(int)loc] & 2U) == 0) || (uVar3 != flev->seenv)) {
            newsym((int)loc,stop);
          }
        }
        else {
          old_row[(int)loc] = old_row[(int)loc] | 2;
          uVar3 = flev->seenv;
          flev->seenv = flev->seenv | *_has_night_vision;
          if (((next_rmin[(int)loc] & 2U) == 0) || (uVar3 != flev->seenv)) {
            newsym((int)loc,stop);
          }
        }
      }
      else {
        uVar3 = flev->seenv;
        flev->seenv = flev->seenv | *_has_night_vision;
        if (((next_rmin[(int)loc] & 2U) == 0) || (uVar3 != flev->seenv)) {
          newsym((int)loc,stop);
        }
      }
      flev = flev + 0x15;
      loc._0_4_ = (int)loc + 1;
      _has_night_vision = _has_night_vision + (int)(uint)vision_recalc::colbump[(int)loc];
    }
  }
  vision_recalc::colbump[u.ux + 1] = '\0';
  vision_recalc::colbump[u.ux] = '\0';
LAB_0033244e:
  if (program_state.panicking == 0) {
    newsym((int)u.ux,(int)u.uy);
  }
  viz_rmax = ranges;
  viz_rmin = next_rmax;
  return;
}

Assistant:

void vision_recalc(int control)
{
    char **temp_array;	/* points to the old vision array */
    char **next_array;	/* points to the new vision array */
    char *next_row;	/* row pointer for the new array */
    char *old_row;	/* row pointer for the old array */
    char *next_rmin;	/* min pointer for the new array */
    char *next_rmax;	/* max pointer for the new array */
    const char *ranges;	/* circle ranges -- used for xray & night vision */
    int row;		/* row counter (outer loop)  */
    int start, stop;	/* inner loop starting/stopping index */
    int dx, dy;		/* one step from a lit door or lit wall (see below) */
    int col;	/* inner loop counter */
    struct rm *loc;	/* pointer to current pos */
    struct rm *flev;	/* pointer to position in "front" of current pos */
    extern unsigned char seenv_matrix[3][3];	/* from display.c */
    static unsigned char colbump[COLNO+1];	/* cols to bump sv */
    unsigned char *sv;				/* ptr to seen angle bits */
    int oldseenv;				/* previous seenv value */

    vision_full_recalc = 0;			/* reset flag */
    if (in_mklev || !iflags.vision_inited) return;

    /*
     * Either the light sources have been taken care of, or we must
     * recalculate them here.
     */

    /* Get the unused could see, row min, and row max arrays. */
    get_unused_cs(&next_array, &next_rmin, &next_rmax);

    /* You see nothing, nothing can see you --- if swallowed or refreshing. */
    if (u.uswallow || control == 2) {
	/* do nothing -- get_unused_cs() nulls out the new work area */

    } else if (Blind) {
	/*
	 * Calculate the could_see array even when blind so that monsters
	 * can see you, even if you can't see them.  Note that the current
	 * setup allows:
	 *
	 *	+ Monsters to see with the "new" vision, even on the rogue
	 *	  level.
	 *
	 *	+ Monsters can see you even when you're in a pit.
	 */
	view_from(u.uy, u.ux, next_array, next_rmin, next_rmax,
		0, (void (*)(int,int,void *))0, 0);

	/*
	 * Our own version of the update loop below.  We know we can't see
	 * anything, so we only need update positions we used to be able
	 * to see.
	 */
	temp_array = viz_array;	/* set viz_array so newsym() will work */
	viz_array = next_array;

	for (row = 0; row < ROWNO; row++) {
	    old_row = temp_array[row];

	    /* Find the min and max positions on the row. */
	    start = min(viz_rmin[row], next_rmin[row]);
	    stop  = max(viz_rmax[row], next_rmax[row]);

	    for (col = start; col <= stop; col++)
		if (old_row[col] & IN_SIGHT) newsym(col,row);
	}

	/* skip the normal update loop */
	goto skip;
    }
    else if (Is_rogue_level(&u.uz)) {
	rogue_vision(next_array,next_rmin,next_rmax);
    }
    else {
	int has_night_vision = 1;	/* hero has night vision */

	if (Underwater && !Is_waterlevel(&u.uz)) {
	    /*
	     * The hero is under water.  Only see surrounding locations if
	     * they are also underwater.  This overrides night vision but
	     * does not override x-ray vision.
	     */
	    has_night_vision = 0;

	    for (row = u.uy-1; row <= u.uy+1; row++)
		for (col = u.ux-1; col <= u.ux+1; col++) {
		    if (!isok(col,row) || !is_pool(level, col,row)) continue;

		    next_rmin[row] = min(next_rmin[row], col);
		    next_rmax[row] = max(next_rmax[row], col);
		    next_array[row][col] = IN_SIGHT | COULD_SEE;
		}
	}

	/* if in a pit, just update for immediate locations */
	else if (u.utrap && u.utraptype == TT_PIT) {
	    for (row = u.uy-1; row <= u.uy+1; row++) {
		if (row < 0) continue;	if (row >= ROWNO) break;

		next_rmin[row] = max(      0, u.ux - 1);
		next_rmax[row] = min(COLNO-1, u.ux + 1);
		next_row = next_array[row];

		for (col=next_rmin[row]; col <= next_rmax[row]; col++)
		    next_row[col] = IN_SIGHT | COULD_SEE;
	    }
	} else
	    view_from(u.uy, u.ux, next_array, next_rmin, next_rmax,
		0, (void (*)(int,int,void *))0, 0);

	/*
	 * Set the IN_SIGHT bit for xray and night vision.
	 */
	if (u.xray_range >= 0) {
	    if (u.xray_range) {
		ranges = circle_ptr(u.xray_range);

		for (row = u.uy-u.xray_range; row <= u.uy+u.xray_range; row++) {
		    if (row < 0) continue;	if (row >= ROWNO) break;
		    dy = v_abs(u.uy-row);	next_row = next_array[row];

		    start = max(      0, u.ux - ranges[dy]);
		    stop  = min(COLNO-1, u.ux + ranges[dy]);

		    for (col = start; col <= stop; col++) {
			char old_row_val = next_row[col];
			next_row[col] |= IN_SIGHT;
			oldseenv = level->locations[col][row].seenv;
			level->locations[col][row].seenv = SVALL;	/* see all! */
			/* Update if previously not in sight or new angle. */
			if (!(old_row_val & IN_SIGHT) || oldseenv != SVALL)
			    newsym(col,row);
		    }

		    next_rmin[row] = min(start, next_rmin[row]);
		    next_rmax[row] = max(stop, next_rmax[row]);
		}

	    } else {	/* range is 0 */
		next_array[u.uy][u.ux] |= IN_SIGHT;
		level->locations[u.ux][u.uy].seenv = SVALL;
		next_rmin[u.uy] = min(u.ux, next_rmin[u.uy]);
		next_rmax[u.uy] = max(u.ux, next_rmax[u.uy]);
	    }
	}

	if (has_night_vision && u.xray_range < u.nv_range) {
	    if (!u.nv_range) {	/* range is 0 */
		next_array[u.uy][u.ux] |= IN_SIGHT;
		level->locations[u.ux][u.uy].seenv = SVALL;
		next_rmin[u.uy] = min(u.ux, next_rmin[u.uy]);
		next_rmax[u.uy] = max(u.ux, next_rmax[u.uy]);
	    } else if (u.nv_range > 0) {
		ranges = circle_ptr(u.nv_range);

		for (row = u.uy-u.nv_range; row <= u.uy+u.nv_range; row++) {
		    if (row < 0) continue;	if (row >= ROWNO) break;
		    dy = v_abs(u.uy-row);	next_row = next_array[row];

		    start = max(      0, u.ux - ranges[dy]);
		    stop  = min(COLNO-1, u.ux + ranges[dy]);

		    for (col = start; col <= stop; col++)
			if (next_row[col]) next_row[col] |= IN_SIGHT;

		    next_rmin[row] = min(start, next_rmin[row]);
		    next_rmax[row] = max(stop, next_rmax[row]);
		}
	    }
	}
    }

    /* Set the correct bits for all light sources. */
    do_light_sources(next_array);


    /*
     * Make the viz_array the new array so that cansee() will work correctly.
     */
    temp_array = viz_array;
    viz_array = next_array;

    /*
     * The main update loop.  Here we do two things:
     *
     *	    + Set the IN_SIGHT bit for places that we could see and are lit.
     *	    + Reset changed places.
     *
     * There is one thing that make deciding what the hero can see
     * difficult:
     *
     *  1.  Directional lighting.  Items that block light create problems.
     *      The worst offenders are doors.  Suppose a door to a lit room
     *      is closed.  It is lit on one side, but not on the other.  How
     *      do you know?  You have to check the closest adjacent position.
     *	    Even so, that is not entirely correct.  But it seems close
     *	    enough for now.
     */
    colbump[u.ux] = colbump[u.ux+1] = 1;
    for (row = 0; row < ROWNO; row++) {
	dy = u.uy - row;                dy = sign(dy);
	next_row = next_array[row];     old_row = temp_array[row];

	/* Find the min and max positions on the row. */
	start = min(viz_rmin[row], next_rmin[row]);
	stop  = max(viz_rmax[row], next_rmax[row]);
	loc = &level->locations[start][row];

	sv = &seenv_matrix[dy+1][start < u.ux ? 0 : (start > u.ux ? 2:1)];

	for (col = start; col <= stop;
				loc += ROWNO, sv += (int) colbump[++col]) {
	    if (next_row[col] & IN_SIGHT) {
		/*
		 * We see this position because of night- or xray-vision.
		 */
		oldseenv = loc->seenv;
		loc->seenv |= new_angle(loc,sv,row,col); /* update seen angle */

		/* Update pos if previously not in sight or new angle. */
		if ( !(old_row[col] & IN_SIGHT) || oldseenv != loc->seenv)
		    newsym(col,row);
	    }

	    else if ((next_row[col] & COULD_SEE)
				&& (loc->lit || (next_row[col] & TEMP_LIT))) {
		/*
		 * We see this position because it is lit.
		 */
		if ((IS_DOOR(loc->typ) || loc->typ == SDOOR ||
		     IS_WALL(loc->typ)) && !viz_clear[row][col]) {
		    /*
		     * Make sure doors, walls, boulders or mimics don't show up
		     * at the end of dark hallways.  We do this by checking
		     * the adjacent position.  If it is lit, then we can see
		     * the door or wall, otherwise we can't.
		     */
		    dx = u.ux - col;	dx = sign(dx);
		    flev = &(level->locations[col+dx][row+dy]);
		    if (flev->lit || next_array[row+dy][col+dx] & TEMP_LIT) {
			next_row[col] |= IN_SIGHT;	/* we see it */

			oldseenv = loc->seenv;
			loc->seenv |= new_angle(loc,sv,row,col);

			/* Update pos if previously not in sight or new angle.*/
			if (!(old_row[col] & IN_SIGHT) || oldseenv!=loc->seenv)
			    newsym(col,row);
		    } else
			goto not_in_sight;	/* we don't see it */

		} else {
		    next_row[col] |= IN_SIGHT;	/* we see it */

		    oldseenv = loc->seenv;
		    loc->seenv |= new_angle(loc,sv,row,col);

		    /* Update pos if previously not in sight or new angle. */
		    if ( !(old_row[col] & IN_SIGHT) || oldseenv != loc->seenv)
			newsym(col,row);
		}
	    } else if ((next_row[col] & COULD_SEE) && loc->waslit) {
		/*
		 * If we make it here, the hero _could see_ the location,
		 * but doesn't see it (location is not lit).
		 * However, the hero _remembers_ it as lit (waslit is true).
		 * The hero can now see that it is not lit, so change waslit
		 * and update the location.
		 */
		loc->waslit = 0; /* remember lit condition */
		newsym(col,row);
	    }
	    /*
	     * At this point we know that the row position is *not* in normal
	     * sight.  That is, the position is could be seen, but is dark
	     * or LOS is just plain blocked.
	     *
	     * Update the position if:
	     * o If the old one *was* in sight.  We may need to clean up
	     *   the glyph -- E.g. darken room spot, etc.
	     * o If we now could see the location (yet the location is not
	     *   lit), but previously we couldn't see the location, or vice
	     *   versa.  Update the spot because there there may be an infared
	     *   monster there.
	     */
	    else {
not_in_sight:
		if ((old_row[col] & IN_SIGHT)
			|| ((next_row[col] & COULD_SEE)
				^ (old_row[col] & COULD_SEE)))
		    newsym(col,row);
	    }

	} /* end for col . . */
    }	/* end for row . .  */
    colbump[u.ux] = colbump[u.ux+1] = 0;

skip:
    /* This newsym() caused a crash delivering msg about failure to open
     * dungeon file init_dungeons() -> panic() -> done(11) ->
     * vision_recalc(2) -> newsym() -> crash!  u.ux and u.uy are 0 and
     * program_state.panicking == 1 under those circumstances
     */
    if (!program_state.panicking)
	newsym(u.ux, u.uy);		/* Make sure the hero shows up! */

    /* Set the new min and max pointers. */
    viz_rmin  = next_rmin;
    viz_rmax = next_rmax;
}